

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_lazy
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *pBVar1;
  undefined8 *puVar2;
  seqDef *psVar3;
  bool bVar4;
  undefined8 uVar5;
  seqStore_t *psVar6;
  U32 lowestValid;
  ulong *puVar7;
  ulong *puVar8;
  ulong *puVar9;
  uint uVar10;
  ulong *puVar11;
  long lVar12;
  int iVar13;
  ulong *puVar14;
  BYTE *pBVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  BYTE *litEnd;
  ulong *ip;
  ulong *puVar23;
  ulong uVar24;
  ulong *puVar25;
  size_t offbaseFound;
  BYTE *pInLoopLimit;
  BYTE *litLimit_w;
  ulong local_b8;
  size_t local_b0;
  uint local_a4;
  ZSTD_matchState_t *local_a0;
  ulong *local_98;
  uint local_8c;
  seqStore_t *local_88;
  ulong *local_80;
  ulong *local_78;
  ulong *local_70;
  long local_68;
  uint local_5c;
  uint local_58;
  uint local_54;
  ulong *local_50;
  ulong *local_48;
  uint *local_40;
  BYTE *local_38;
  
  puVar14 = (ulong *)((long)src + srcSize);
  pBVar15 = (ms->window).base;
  uVar10 = (ms->window).dictLimit;
  local_38 = pBVar15 + uVar10;
  uVar18 = (ms->cParams).minMatch;
  uVar19 = 6;
  if (uVar18 < 6) {
    uVar19 = uVar18;
  }
  uVar18 = 4;
  if (4 < uVar19) {
    uVar18 = uVar19;
  }
  local_54 = *rep;
  ip = (ulong *)((ulong)((int)src == (int)local_38) + (long)src);
  iVar13 = (int)ip - (int)pBVar15;
  uVar19 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  local_58 = iVar13 - uVar19;
  if (iVar13 - uVar10 <= uVar19) {
    local_58 = uVar10;
  }
  if (ms->loadedDictEnd != 0) {
    local_58 = uVar10;
  }
  local_5c = rep[1];
  local_58 = iVar13 - local_58;
  uVar10 = local_5c;
  if (local_58 < local_5c) {
    uVar10 = 0;
  }
  uVar21 = (ulong)uVar10;
  uVar19 = local_54;
  if (local_58 < local_54) {
    uVar19 = 0;
  }
  uVar20 = (ulong)uVar19;
  local_80 = (ulong *)((long)src + (srcSize - 8));
  ms->lazySkipping = 0;
  local_40 = rep;
  if (ip < local_80) {
    puVar8 = (ulong *)((long)puVar14 + -7);
    local_70 = (ulong *)((long)puVar14 + -3);
    local_78 = (ulong *)((long)puVar14 + -1);
    local_48 = puVar14 + -4;
    local_a0 = ms;
    local_98 = puVar8;
    local_88 = seqStore;
    local_50 = puVar14;
    do {
      local_68 = -uVar20;
      local_a4 = (uint)uVar20;
      if (local_a4 == 0) {
        uVar24 = 0;
      }
      else {
        uVar24 = 0;
        if (*(int *)(((long)ip + 1) - uVar20) == *(int *)((long)ip + 1)) {
          puVar25 = (ulong *)((long)ip + 5);
          puVar9 = (ulong *)((long)ip + local_68 + 5);
          puVar23 = puVar25;
          if (puVar25 < puVar8) {
            uVar24 = *puVar25 ^ *puVar9;
            uVar20 = 0;
            if (uVar24 != 0) {
              for (; (uVar24 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
              }
            }
            uVar24 = uVar20 >> 3 & 0x1fffffff;
            if (*puVar9 == *puVar25) {
              puVar23 = (ulong *)((long)ip + 0xd);
              puVar9 = (ulong *)((long)ip + local_68 + 0xd);
              do {
                if (puVar8 <= puVar23) goto LAB_00723dbf;
                uVar20 = *puVar9;
                uVar22 = *puVar23;
                uVar16 = uVar22 ^ uVar20;
                uVar24 = 0;
                if (uVar16 != 0) {
                  for (; (uVar16 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                  }
                }
                uVar24 = (long)puVar23 + ((uVar24 >> 3 & 0x1fffffff) - (long)puVar25);
                puVar23 = puVar23 + 1;
                puVar9 = puVar9 + 1;
              } while (uVar20 == uVar22);
            }
          }
          else {
LAB_00723dbf:
            if ((puVar23 < local_70) && ((int)*puVar9 == (int)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 4);
              puVar9 = (ulong *)((long)puVar9 + 4);
            }
            if ((puVar23 < local_78) && ((short)*puVar9 == (short)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 2);
              puVar9 = (ulong *)((long)puVar9 + 2);
            }
            if (puVar23 < puVar14) {
              puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar9 == (char)*puVar23));
            }
            uVar24 = (long)puVar23 - (long)puVar25;
          }
          uVar24 = uVar24 + 4;
        }
      }
      local_b0 = 999999999;
      local_8c = (uint)uVar21;
      if (uVar18 == 6) {
        uVar20 = ZSTD_HcFindBestMatch_noDict_6(local_a0,(BYTE *)ip,(BYTE *)puVar14,&local_b0);
      }
      else if (uVar18 == 5) {
        uVar20 = ZSTD_HcFindBestMatch_noDict_5(local_a0,(BYTE *)ip,(BYTE *)puVar14,&local_b0);
      }
      else {
        uVar20 = ZSTD_HcFindBestMatch_noDict_4(local_a0,(BYTE *)ip,(BYTE *)puVar14,&local_b0);
      }
      local_b8 = uVar24;
      if (uVar24 < uVar20) {
        local_b8 = uVar20;
      }
      uVar21 = (ulong)local_8c;
      if (local_b8 < 4) {
        uVar20 = (long)ip - (long)src;
        ip = (ulong *)((long)ip + (uVar20 >> 8) + 1);
        local_a0->lazySkipping = (uint)(0x7ff < uVar20);
        uVar20 = (ulong)local_a4;
        puVar8 = local_98;
      }
      else {
        puVar8 = ip;
        uVar22 = local_b0;
        if (uVar20 <= uVar24) {
          puVar8 = (ulong *)((long)ip + 1);
          uVar22 = 1;
        }
        puVar25 = (ulong *)((long)ip + local_68 + 0xd);
        do {
          uVar10 = (uint)uVar21;
          if (local_80 <= ip) break;
          puVar23 = (ulong *)((long)ip + 1);
          if (((uVar22 != 0) && (local_a4 != 0)) &&
             (*(int *)puVar23 == *(int *)((long)puVar23 + local_68))) {
            puVar9 = (ulong *)((long)ip + 5);
            puVar11 = (ulong *)((long)ip + local_68 + 5);
            puVar7 = puVar9;
            if (puVar9 < local_98) {
              uVar20 = *puVar9 ^ *puVar11;
              uVar21 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                }
              }
              uVar21 = uVar21 >> 3 & 0x1fffffff;
              if (*puVar11 == *puVar9) {
                puVar7 = (ulong *)((long)ip + 0xd);
                puVar11 = puVar25;
                do {
                  if (local_98 <= puVar7) goto LAB_00723f85;
                  uVar20 = *puVar11;
                  uVar24 = *puVar7;
                  uVar16 = uVar24 ^ uVar20;
                  uVar21 = 0;
                  if (uVar16 != 0) {
                    for (; (uVar16 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                    }
                  }
                  uVar21 = (long)puVar7 + ((uVar21 >> 3 & 0x1fffffff) - (long)puVar9);
                  puVar7 = puVar7 + 1;
                  puVar11 = puVar11 + 1;
                } while (uVar20 == uVar24);
              }
            }
            else {
LAB_00723f85:
              if ((puVar7 < local_70) && ((int)*puVar11 == (int)*puVar7)) {
                puVar7 = (ulong *)((long)puVar7 + 4);
                puVar11 = (ulong *)((long)puVar11 + 4);
              }
              if ((puVar7 < local_78) && ((short)*puVar11 == (short)*puVar7)) {
                puVar7 = (ulong *)((long)puVar7 + 2);
                puVar11 = (ulong *)((long)puVar11 + 2);
              }
              if (puVar7 < puVar14) {
                puVar7 = (ulong *)((long)puVar7 + (ulong)((char)*puVar11 == (char)*puVar7));
              }
              uVar21 = (long)puVar7 - (long)puVar9;
            }
            uVar10 = (uint)uVar22;
            if (uVar10 == 0) goto LAB_00724534;
            if (uVar21 < 0xfffffffffffffffc) {
              uVar19 = 0x1f;
              if (uVar10 != 0) {
                for (; uVar10 >> uVar19 == 0; uVar19 = uVar19 - 1) {
                }
              }
              if ((int)((uVar19 ^ 0x1f) + (int)local_b8 * 3 + -0x1e) < (int)(uVar21 + 4) * 3) {
                uVar22 = 1;
                puVar8 = puVar23;
                local_b8 = uVar21 + 4;
              }
            }
          }
          local_b0 = 999999999;
          if (uVar18 == 6) {
            uVar20 = ZSTD_HcFindBestMatch_noDict_6
                               (local_a0,(BYTE *)puVar23,(BYTE *)puVar14,&local_b0);
          }
          else if (uVar18 == 5) {
            uVar20 = ZSTD_HcFindBestMatch_noDict_5
                               (local_a0,(BYTE *)puVar23,(BYTE *)puVar14,&local_b0);
          }
          else {
            uVar20 = ZSTD_HcFindBestMatch_noDict_4
                               (local_a0,(BYTE *)puVar23,(BYTE *)puVar14,&local_b0);
          }
          uVar10 = (uint)local_b0;
          uVar21 = (ulong)local_8c;
          if ((uVar10 == 0) || (uVar19 = (uint)uVar22, uVar19 == 0)) {
LAB_00724534:
            __assert_fail("val != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bits.h"
                          ,0xab,"unsigned int ZSTD_highbit32(U32)");
          }
          bVar4 = true;
          if (3 < uVar20) {
            iVar13 = 0x1f;
            if (uVar10 != 0) {
              for (; uVar10 >> iVar13 == 0; iVar13 = iVar13 + -1) {
              }
            }
            uVar10 = 0x1f;
            if (uVar19 != 0) {
              for (; uVar19 >> uVar10 == 0; uVar10 = uVar10 - 1) {
              }
            }
            if ((int)((uVar10 ^ 0x1f) + (int)local_b8 * 4 + -0x1b) < (int)uVar20 * 4 - iVar13) {
              bVar4 = false;
              puVar8 = puVar23;
              uVar22 = local_b0;
              local_b8 = uVar20;
            }
          }
          puVar25 = (ulong *)((long)puVar25 + 1);
          ip = puVar23;
          uVar10 = local_8c;
        } while (!bVar4);
        uVar19 = local_a4;
        if (3 < uVar22) {
          if ((src < puVar8) && (local_38 < (BYTE *)((long)puVar8 + (3 - uVar22)))) {
            puVar14 = puVar8;
            while (puVar8 = puVar14,
                  *(char *)((long)puVar14 - 1) == *(char *)((long)puVar14 + (2 - uVar22))) {
              puVar8 = (ulong *)((long)puVar14 - 1);
              local_b8 = local_b8 + 1;
              if ((puVar8 <= src) ||
                 (pBVar15 = (BYTE *)((long)puVar14 + (2 - uVar22)), puVar14 = puVar8,
                 pBVar15 <= local_38)) break;
            }
          }
          uVar10 = local_a4;
          uVar19 = (U32)uVar22 - 3;
        }
        uVar24 = (ulong)uVar19;
        uVar21 = (ulong)uVar10;
        if (local_88->maxNbSeq <=
            (ulong)((long)local_88->sequences - (long)local_88->sequencesStart >> 3)) {
LAB_007245cf:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_88->maxNbLit) {
LAB_00724591:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar20 = (long)puVar8 - (long)src;
        puVar14 = (ulong *)local_88->lit;
        if (local_88->litStart + local_88->maxNbLit < (BYTE *)((long)puVar14 + uVar20)) {
LAB_00724572:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_50 < puVar8) {
LAB_00724553:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a1,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_48 < puVar8) {
          ZSTD_safecopyLiterals((BYTE *)puVar14,(BYTE *)src,(BYTE *)puVar8,(BYTE *)local_48);
        }
        else {
          uVar16 = *(ulong *)((long)src + 8);
          *puVar14 = *src;
          puVar14[1] = uVar16;
          if (0x10 < uVar20) {
            pBVar15 = local_88->lit;
            if (0xffffffffffffffe0 < (ulong)((long)(pBVar15 + 0x10) + (-0x10 - ((long)src + 0x10))))
            {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar16 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar15 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar15 + 0x18) = uVar16;
            if (0x20 < (long)uVar20) {
              lVar12 = 0;
              do {
                puVar2 = (undefined8 *)((long)src + lVar12 + 0x20);
                uVar5 = puVar2[1];
                pBVar1 = pBVar15 + lVar12 + 0x20;
                *(undefined8 *)pBVar1 = *puVar2;
                *(undefined8 *)(pBVar1 + 8) = uVar5;
                puVar2 = (undefined8 *)((long)src + lVar12 + 0x30);
                uVar5 = puVar2[1];
                *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar1 + 0x18) = uVar5;
                lVar12 = lVar12 + 0x20;
              } while (pBVar1 + 0x20 < pBVar15 + uVar20);
            }
          }
        }
        puVar14 = local_50;
        psVar6 = local_88;
        local_88->lit = local_88->lit + uVar20;
        if (0xffff < uVar20) {
          if (local_88->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2b2,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_88->longLengthType = ZSTD_llt_literalLength;
          local_88->longLengthPos =
               (U32)((ulong)((long)local_88->sequences - (long)local_88->sequencesStart) >> 3);
        }
        psVar3 = local_88->sequences;
        psVar3->litLength = (U16)uVar20;
        psVar3->offBase = (U32)uVar22;
        if (local_b8 < 3) {
LAB_007245b0:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < local_b8 - 3) {
          if (local_88->longLengthType != ZSTD_llt_none) {
LAB_007245ee:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2bf,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_88->longLengthType = ZSTD_llt_matchLength;
          local_88->longLengthPos =
               (U32)((ulong)((long)psVar3 - (long)local_88->sequencesStart) >> 3);
        }
        psVar3->mlBase = (U16)(local_b8 - 3);
        local_88->sequences = psVar3 + 1;
        if (local_a0->lazySkipping != 0) {
          local_a0->lazySkipping = 0;
        }
        ip = (ulong *)((long)puVar8 + local_b8);
        uVar20 = uVar24;
        puVar8 = local_98;
        src = ip;
        if ((uVar10 != 0) && (ip <= local_80)) {
          while (uVar22 = uVar21, uVar20 = uVar24, uVar21 = uVar22, src = ip,
                (int)*ip == *(int *)((long)ip - uVar22)) {
            puVar25 = (ulong *)((long)ip + 4);
            puVar9 = (ulong *)((long)ip + (4 - uVar22));
            puVar23 = puVar25;
            if (puVar25 < puVar8) {
              uVar20 = *puVar25 ^ *puVar9;
              uVar21 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                }
              }
              uVar21 = uVar21 >> 3 & 0x1fffffff;
              if (*puVar9 == *puVar25) {
                puVar23 = (ulong *)((long)ip + 0xc);
                puVar9 = (ulong *)((long)ip + (0xc - uVar22));
                do {
                  if (puVar8 <= puVar23) goto LAB_00724379;
                  uVar20 = *puVar9;
                  uVar16 = *puVar23;
                  uVar17 = uVar16 ^ uVar20;
                  uVar21 = 0;
                  if (uVar17 != 0) {
                    for (; (uVar17 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                    }
                  }
                  uVar21 = (long)puVar23 + ((uVar21 >> 3 & 0x1fffffff) - (long)puVar25);
                  puVar23 = puVar23 + 1;
                  puVar9 = puVar9 + 1;
                } while (uVar20 == uVar16);
              }
            }
            else {
LAB_00724379:
              if ((puVar23 < local_70) && ((int)*puVar9 == (int)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 4);
                puVar9 = (ulong *)((long)puVar9 + 4);
              }
              if ((puVar23 < local_78) && ((short)*puVar9 == (short)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 2);
                puVar9 = (ulong *)((long)puVar9 + 2);
              }
              if (puVar23 < puVar14) {
                puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar9 == (char)*puVar23));
              }
              uVar21 = (long)puVar23 - (long)puVar25;
            }
            if (psVar6->maxNbSeq <=
                (ulong)((long)psVar6->sequences - (long)psVar6->sequencesStart >> 3))
            goto LAB_007245cf;
            if (0x20000 < psVar6->maxNbLit) goto LAB_00724591;
            puVar25 = (ulong *)psVar6->lit;
            if (psVar6->litStart + psVar6->maxNbLit < puVar25) goto LAB_00724572;
            if (puVar14 < ip) goto LAB_00724553;
            if (local_48 < ip) {
              ZSTD_safecopyLiterals((BYTE *)puVar25,(BYTE *)ip,(BYTE *)ip,(BYTE *)local_48);
              puVar8 = local_98;
            }
            else {
              uVar20 = ip[1];
              *puVar25 = *ip;
              puVar25[1] = uVar20;
            }
            psVar3 = psVar6->sequences;
            psVar3->litLength = 0;
            psVar3->offBase = 1;
            if (uVar21 + 4 < 3) goto LAB_007245b0;
            if (0xffff < uVar21 + 1) {
              if (psVar6->longLengthType != ZSTD_llt_none) goto LAB_007245ee;
              psVar6->longLengthType = ZSTD_llt_matchLength;
              psVar6->longLengthPos =
                   (U32)((ulong)((long)psVar3 - (long)psVar6->sequencesStart) >> 3);
            }
            psVar3->mlBase = (U16)(uVar21 + 1);
            psVar6->sequences = psVar3 + 1;
            ip = (ulong *)((long)ip + uVar21 + 4);
            uVar20 = uVar22;
            uVar21 = uVar24;
            src = ip;
            if (((int)uVar24 == 0) || (uVar24 = uVar22, local_80 < ip)) break;
          }
        }
      }
      uVar10 = (uint)uVar21;
      uVar19 = (uint)uVar20;
    } while (ip < local_80);
  }
  if (local_5c <= local_58) {
    local_5c = 0;
  }
  uVar18 = local_5c;
  if (uVar19 != 0) {
    uVar18 = local_54;
  }
  if (local_54 <= local_58) {
    uVar18 = local_5c;
    local_54 = 0;
  }
  if (uVar19 != 0) {
    local_54 = uVar19;
  }
  if (uVar10 != 0) {
    uVar18 = uVar10;
  }
  *local_40 = local_54;
  local_40[1] = uVar18;
  return (long)puVar14 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1, ZSTD_noDict);
}